

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

void __thiscall
Clasp::ClaspConfig::addConfigurator(ClaspConfig *this,Configurator *c,Type t,bool once)

{
  Impl::add((Impl *)this,c,t,once);
  return;
}

Assistant:

void ClaspConfig::addConfigurator(Configurator* c, Ownership_t::Type t, bool once) {
	impl_->add(c, t, once);
}